

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void __thiscall soul::ResolutionPass::TypeResolver::~TypeResolver(TypeResolver *this)

{
  ~TypeResolver(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

static inline constexpr const char* getPassName()  { return "TypeResolver"; }